

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog
                      )

{
  void *buffer;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  char cVar23;
  uint uVar24;
  ulong uVar25;
  size_t sVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong srcSize;
  BYTE *ostart;
  char *pcVar31;
  undefined1 auVar32 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar55;
  int iVar56;
  undefined1 auVar53 [16];
  int iVar57;
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar75;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  BYTE bitsToWeight [13];
  S16 norm [13];
  uint count [13];
  BYTE huffWeight [255];
  BYTE scratchBuffer [64];
  FSE_CTable CTable_1 [59];
  uint local_2f4;
  char local_2ed [13];
  undefined8 local_2e0;
  char *local_2d8;
  size_t local_2d0;
  short local_2c8 [16];
  uint local_2a8 [16];
  char local_268 [256];
  undefined1 local_168 [64];
  FSE_CTable local_128 [62];
  
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  local_2ed[0] = '\0';
  uVar24 = huffLog + 1;
  if (1 < uVar24) {
    lVar28 = (ulong)uVar24 - 2;
    auVar32._8_4_ = (int)lVar28;
    auVar32._0_8_ = lVar28;
    auVar32._12_4_ = (int)((ulong)lVar28 >> 0x20);
    lVar28 = 0;
    lVar30 = 0;
    do {
      auVar50._8_4_ = (int)lVar30;
      auVar50._0_8_ = lVar30;
      auVar50._12_4_ = (int)((ulong)lVar30 >> 0x20);
      auVar53 = auVar32 ^ _DAT_004e7c90;
      auVar58 = (auVar50 | _DAT_004e7c80) ^ _DAT_004e7c90;
      iVar52 = auVar53._0_4_;
      iVar71 = -(uint)(iVar52 < auVar58._0_4_);
      iVar55 = auVar53._4_4_;
      auVar60._4_4_ = -(uint)(iVar55 < auVar58._4_4_);
      iVar56 = auVar53._8_4_;
      iVar75 = -(uint)(iVar56 < auVar58._8_4_);
      iVar57 = auVar53._12_4_;
      auVar60._12_4_ = -(uint)(iVar57 < auVar58._12_4_);
      auVar33._4_4_ = iVar71;
      auVar33._0_4_ = iVar71;
      auVar33._8_4_ = iVar75;
      auVar33._12_4_ = iVar75;
      auVar33 = pshuflw(in_XMM1,auVar33,0xe8);
      auVar59._4_4_ = -(uint)(auVar58._4_4_ == iVar55);
      auVar59._12_4_ = -(uint)(auVar58._12_4_ == iVar57);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar42 = pshuflw(in_XMM2,auVar59,0xe8);
      auVar60._0_4_ = auVar60._4_4_;
      auVar60._8_4_ = auVar60._12_4_;
      auVar58 = pshuflw(auVar33,auVar60,0xe8);
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar53 = (auVar58 | auVar42 & auVar33) ^ auVar53;
      auVar53 = packssdw(auVar53,auVar53);
      cVar22 = (char)huffLog;
      cVar23 = (char)lVar28;
      if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2ed[lVar30 + 1] = cVar22 + cVar23;
      }
      auVar42._4_4_ = iVar71;
      auVar42._0_4_ = iVar71;
      auVar42._8_4_ = iVar75;
      auVar42._12_4_ = iVar75;
      auVar60 = auVar59 & auVar42 | auVar60;
      auVar53 = packssdw(auVar60,auVar60);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar58,auVar53 ^ auVar58);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._0_4_ >> 8 & 1) != 0) {
        local_2ed[lVar30 + 2] = cVar22 + cVar23 + -1;
      }
      auVar53 = (auVar50 | _DAT_004e7c70) ^ _DAT_004e7c90;
      auVar43._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar43._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar43._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar43._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar61._4_4_ = auVar43._0_4_;
      auVar61._0_4_ = auVar43._0_4_;
      auVar61._8_4_ = auVar43._8_4_;
      auVar61._12_4_ = auVar43._8_4_;
      iVar71 = -(uint)(auVar53._4_4_ == iVar55);
      iVar75 = -(uint)(auVar53._12_4_ == iVar57);
      auVar10._4_4_ = iVar71;
      auVar10._0_4_ = iVar71;
      auVar10._8_4_ = iVar75;
      auVar10._12_4_ = iVar75;
      auVar72._4_4_ = auVar43._4_4_;
      auVar72._0_4_ = auVar43._4_4_;
      auVar72._8_4_ = auVar43._12_4_;
      auVar72._12_4_ = auVar43._12_4_;
      auVar53 = auVar10 & auVar61 | auVar72;
      auVar53 = packssdw(auVar53,auVar53);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar1,auVar53 ^ auVar1);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
        local_2ed[lVar30 + 3] = cVar22 + cVar23 + -2;
      }
      auVar53 = pshufhw(auVar53,auVar61,0x84);
      auVar11._4_4_ = iVar71;
      auVar11._0_4_ = iVar71;
      auVar11._8_4_ = iVar75;
      auVar11._12_4_ = iVar75;
      auVar58 = pshufhw(auVar43,auVar11,0x84);
      auVar33 = pshufhw(auVar53,auVar72,0x84);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar33 | auVar58 & auVar53) ^ auVar34;
      auVar53 = packssdw(auVar34,auVar34);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._0_4_ >> 0x18 & 1) != 0) {
        local_2ed[lVar30 + 4] = cVar22 + cVar23 + -3;
      }
      auVar53 = (auVar50 | _DAT_0050e170) ^ _DAT_004e7c90;
      auVar44._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar44._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar44._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar44._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar12._4_4_ = auVar44._0_4_;
      auVar12._0_4_ = auVar44._0_4_;
      auVar12._8_4_ = auVar44._8_4_;
      auVar12._12_4_ = auVar44._8_4_;
      auVar58 = pshuflw(auVar72,auVar12,0xe8);
      auVar35._0_4_ = -(uint)(auVar53._0_4_ == iVar52);
      auVar35._4_4_ = -(uint)(auVar53._4_4_ == iVar55);
      auVar35._8_4_ = -(uint)(auVar53._8_4_ == iVar56);
      auVar35._12_4_ = -(uint)(auVar53._12_4_ == iVar57);
      auVar62._4_4_ = auVar35._4_4_;
      auVar62._0_4_ = auVar35._4_4_;
      auVar62._8_4_ = auVar35._12_4_;
      auVar62._12_4_ = auVar35._12_4_;
      auVar53 = pshuflw(auVar35,auVar62,0xe8);
      auVar63._4_4_ = auVar44._4_4_;
      auVar63._0_4_ = auVar44._4_4_;
      auVar63._8_4_ = auVar44._12_4_;
      auVar63._12_4_ = auVar44._12_4_;
      auVar33 = pshuflw(auVar44,auVar63,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 & auVar58,(auVar33 | auVar53 & auVar58) ^ auVar2);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_2ed[lVar30 + 5] = cVar22 + cVar23 + -4;
      }
      auVar13._4_4_ = auVar44._0_4_;
      auVar13._0_4_ = auVar44._0_4_;
      auVar13._8_4_ = auVar44._8_4_;
      auVar13._12_4_ = auVar44._8_4_;
      auVar63 = auVar62 & auVar13 | auVar63;
      auVar33 = packssdw(auVar63,auVar63);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53,auVar33 ^ auVar3);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._4_2_ >> 8 & 1) != 0) {
        local_2ed[lVar30 + 6] = cVar22 + cVar23 + -5;
      }
      auVar53 = (auVar50 | _DAT_0050e160) ^ _DAT_004e7c90;
      auVar45._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar45._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar45._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar45._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar64._4_4_ = auVar45._0_4_;
      auVar64._0_4_ = auVar45._0_4_;
      auVar64._8_4_ = auVar45._8_4_;
      auVar64._12_4_ = auVar45._8_4_;
      iVar71 = -(uint)(auVar53._4_4_ == iVar55);
      iVar75 = -(uint)(auVar53._12_4_ == iVar57);
      auVar14._4_4_ = iVar71;
      auVar14._0_4_ = iVar71;
      auVar14._8_4_ = iVar75;
      auVar14._12_4_ = iVar75;
      auVar73._4_4_ = auVar45._4_4_;
      auVar73._0_4_ = auVar45._4_4_;
      auVar73._8_4_ = auVar45._12_4_;
      auVar73._12_4_ = auVar45._12_4_;
      auVar53 = auVar14 & auVar64 | auVar73;
      auVar53 = packssdw(auVar53,auVar53);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar4,auVar53 ^ auVar4);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_2ed[lVar30 + 7] = cVar22 + cVar23 + -6;
      }
      auVar53 = pshufhw(auVar53,auVar64,0x84);
      auVar15._4_4_ = iVar71;
      auVar15._0_4_ = iVar71;
      auVar15._8_4_ = iVar75;
      auVar15._12_4_ = iVar75;
      auVar58 = pshufhw(auVar45,auVar15,0x84);
      auVar33 = pshufhw(auVar53,auVar73,0x84);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar33 | auVar58 & auVar53) ^ auVar36;
      auVar53 = packssdw(auVar36,auVar36);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._6_2_ >> 8 & 1) != 0) {
        local_2ed[lVar30 + 8] = cVar22 + cVar23 + -7;
      }
      auVar53 = (auVar50 | _DAT_00527460) ^ _DAT_004e7c90;
      auVar46._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar46._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar46._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar46._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar16._4_4_ = auVar46._0_4_;
      auVar16._0_4_ = auVar46._0_4_;
      auVar16._8_4_ = auVar46._8_4_;
      auVar16._12_4_ = auVar46._8_4_;
      auVar58 = pshuflw(auVar73,auVar16,0xe8);
      auVar37._0_4_ = -(uint)(auVar53._0_4_ == iVar52);
      auVar37._4_4_ = -(uint)(auVar53._4_4_ == iVar55);
      auVar37._8_4_ = -(uint)(auVar53._8_4_ == iVar56);
      auVar37._12_4_ = -(uint)(auVar53._12_4_ == iVar57);
      auVar65._4_4_ = auVar37._4_4_;
      auVar65._0_4_ = auVar37._4_4_;
      auVar65._8_4_ = auVar37._12_4_;
      auVar65._12_4_ = auVar37._12_4_;
      auVar53 = pshuflw(auVar37,auVar65,0xe8);
      auVar66._4_4_ = auVar46._4_4_;
      auVar66._0_4_ = auVar46._4_4_;
      auVar66._8_4_ = auVar46._12_4_;
      auVar66._12_4_ = auVar46._12_4_;
      auVar33 = pshuflw(auVar46,auVar66,0xe8);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar33 | auVar53 & auVar58) ^ auVar47;
      auVar33 = packssdw(auVar47,auVar47);
      auVar53 = packsswb(auVar53 & auVar58,auVar33);
      if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_2ed[lVar30 + 9] = cVar22 + cVar23 + -8;
      }
      auVar17._4_4_ = auVar46._0_4_;
      auVar17._0_4_ = auVar46._0_4_;
      auVar17._8_4_ = auVar46._8_4_;
      auVar17._12_4_ = auVar46._8_4_;
      auVar66 = auVar65 & auVar17 | auVar66;
      auVar33 = packssdw(auVar66,auVar66);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar5,auVar33 ^ auVar5);
      auVar53 = packsswb(auVar53,auVar33);
      if ((auVar53._8_2_ >> 8 & 1) != 0) {
        local_2ed[lVar30 + 10] = cVar22 + cVar23 + -9;
      }
      auVar53 = (auVar50 | _DAT_00527450) ^ _DAT_004e7c90;
      auVar48._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar48._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar48._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar48._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar67._4_4_ = auVar48._0_4_;
      auVar67._0_4_ = auVar48._0_4_;
      auVar67._8_4_ = auVar48._8_4_;
      auVar67._12_4_ = auVar48._8_4_;
      iVar71 = -(uint)(auVar53._4_4_ == iVar55);
      iVar75 = -(uint)(auVar53._12_4_ == iVar57);
      auVar18._4_4_ = iVar71;
      auVar18._0_4_ = iVar71;
      auVar18._8_4_ = iVar75;
      auVar18._12_4_ = iVar75;
      auVar74._4_4_ = auVar48._4_4_;
      auVar74._0_4_ = auVar48._4_4_;
      auVar74._8_4_ = auVar48._12_4_;
      auVar74._12_4_ = auVar48._12_4_;
      auVar53 = auVar18 & auVar67 | auVar74;
      auVar53 = packssdw(auVar53,auVar53);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar6,auVar53 ^ auVar6);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_2ed[lVar30 + 0xb] = cVar22 + cVar23 + -10;
      }
      auVar53 = pshufhw(auVar53,auVar67,0x84);
      auVar19._4_4_ = iVar71;
      auVar19._0_4_ = iVar71;
      auVar19._8_4_ = iVar75;
      auVar19._12_4_ = iVar75;
      auVar58 = pshufhw(auVar48,auVar19,0x84);
      auVar33 = pshufhw(auVar53,auVar74,0x84);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar33 | auVar58 & auVar53) ^ auVar38;
      auVar53 = packssdw(auVar38,auVar38);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._10_2_ >> 8 & 1) != 0) {
        local_2ed[lVar30 + 0xc] = cVar22 + cVar23 + -0xb;
      }
      auVar53 = (auVar50 | _DAT_00527440) ^ _DAT_004e7c90;
      auVar49._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar49._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar49._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar49._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar20._4_4_ = auVar49._0_4_;
      auVar20._0_4_ = auVar49._0_4_;
      auVar20._8_4_ = auVar49._8_4_;
      auVar20._12_4_ = auVar49._8_4_;
      auVar58 = pshuflw(auVar74,auVar20,0xe8);
      auVar39._0_4_ = -(uint)(auVar53._0_4_ == iVar52);
      auVar39._4_4_ = -(uint)(auVar53._4_4_ == iVar55);
      auVar39._8_4_ = -(uint)(auVar53._8_4_ == iVar56);
      auVar39._12_4_ = -(uint)(auVar53._12_4_ == iVar57);
      auVar68._4_4_ = auVar39._4_4_;
      auVar68._0_4_ = auVar39._4_4_;
      auVar68._8_4_ = auVar39._12_4_;
      auVar68._12_4_ = auVar39._12_4_;
      auVar53 = pshuflw(auVar39,auVar68,0xe8);
      auVar69._4_4_ = auVar49._4_4_;
      auVar69._0_4_ = auVar49._4_4_;
      auVar69._8_4_ = auVar49._12_4_;
      auVar69._12_4_ = auVar49._12_4_;
      auVar33 = pshuflw(auVar49,auVar69,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 & auVar58,(auVar33 | auVar53 & auVar58) ^ auVar7);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar30) = cVar22 + cVar23 + -0xc;
      }
      auVar21._4_4_ = auVar49._0_4_;
      auVar21._0_4_ = auVar49._0_4_;
      auVar21._8_4_ = auVar49._8_4_;
      auVar21._12_4_ = auVar49._8_4_;
      auVar69 = auVar68 & auVar21 | auVar69;
      auVar33 = packssdw(auVar69,auVar69);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53,auVar33 ^ auVar8);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._12_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_2e0 + lVar30 + 1) = cVar22 + cVar23 + -0xd;
      }
      auVar53 = (auVar50 | _DAT_00527430) ^ _DAT_004e7c90;
      auVar40._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar40._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar40._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar40._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar70._4_4_ = auVar40._0_4_;
      auVar70._0_4_ = auVar40._0_4_;
      auVar70._8_4_ = auVar40._8_4_;
      auVar70._12_4_ = auVar40._8_4_;
      auVar51._4_4_ = -(uint)(auVar53._4_4_ == iVar55);
      auVar51._12_4_ = -(uint)(auVar53._12_4_ == iVar57);
      auVar51._0_4_ = auVar51._4_4_;
      auVar51._8_4_ = auVar51._12_4_;
      auVar54._4_4_ = auVar40._4_4_;
      auVar54._0_4_ = auVar40._4_4_;
      auVar54._8_4_ = auVar40._12_4_;
      auVar54._12_4_ = auVar40._12_4_;
      auVar33 = auVar51 & auVar70 | auVar54;
      auVar53 = packssdw(auVar40,auVar33);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar9,auVar53 ^ auVar9);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2e0 + lVar30 + 2) = cVar22 + cVar23 + -0xe;
      }
      auVar53 = pshufhw(auVar53,auVar70,0x84);
      auVar33 = pshufhw(auVar33,auVar51,0x84);
      in_XMM2 = auVar33 & auVar53;
      auVar53 = pshufhw(auVar53,auVar54,0x84);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar53 | in_XMM2) ^ auVar41;
      auVar53 = packssdw(auVar41,auVar41);
      in_XMM1 = packsswb(auVar53,auVar53);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_2e0 + lVar30 + 3) = cVar22 + cVar23 + -0xf;
      }
      lVar30 = lVar30 + 0x10;
      lVar28 = lVar28 + -0x10;
    } while (-lVar28 != ((ulong)uVar24 + 0xe & 0xfffffffffffffff0));
  }
  local_2d8 = (char *)dst;
  if (maxSymbolValue == 0) {
    srcSize = 0;
  }
  else {
    srcSize = (ulong)maxSymbolValue;
    uVar25 = 0;
    do {
      local_268[uVar25] = local_2ed[CTable[uVar25].nbBits];
      uVar25 = uVar25 + 1;
    } while (srcSize != uVar25);
    buffer = (void *)((long)dst + 1);
    local_2f4 = 0xc;
    if ((maxSymbolValue != 1) &&
       (uVar24 = HIST_count_simple(local_2a8,&local_2f4,local_268,srcSize),
       uVar24 != 1 && uVar24 != maxSymbolValue)) {
      local_2e0 = maxDstSize;
      uVar24 = FSE_optimalTableLog(6,srcSize,local_2f4);
      sVar26 = FSE_normalizeCount(local_2c8,uVar24,local_2a8,srcSize,local_2f4);
      if (0xffffffffffffff88 < sVar26) {
        return sVar26;
      }
      sVar26 = local_2e0 - 1;
      sVar27 = FSE_writeNCount(buffer,sVar26,local_2c8,local_2f4,uVar24);
      if (0xffffffffffffff88 < sVar27) {
        return sVar27;
      }
      local_2d0 = sVar26;
      sVar26 = FSE_buildCTable_wksp(local_128,local_2c8,local_2f4,uVar24,local_168,0x40);
      if (0xffffffffffffff88 < sVar26) {
        return sVar26;
      }
      sVar26 = FSE_compress_usingCTable
                         ((void *)(sVar27 + (long)buffer),local_2d0 - sVar27,local_268,srcSize,
                          local_128);
      if (0xffffffffffffff88 < sVar26) {
        return sVar26;
      }
      maxDstSize = local_2e0;
      if (sVar26 != 0) {
        uVar25 = (long)(sVar27 + (long)buffer) + (sVar26 - (long)buffer);
        if (0xffffffffffffff88 < uVar25) {
          return uVar25;
        }
        local_2d8 = local_2d8;
        if (uVar25 < maxSymbolValue >> 1 && 1 < uVar25) {
          *local_2d8 = (char)uVar25;
          return uVar25 + 1;
        }
      }
    }
  }
  pcVar31 = (char *)((long)dst + 1);
  uVar25 = 0xffffffffffffffff;
  if (maxSymbolValue < 0x81) {
    uVar29 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
    uVar25 = 0xffffffffffffffba;
    if (uVar29 <= maxDstSize) {
      *local_2d8 = (char)maxSymbolValue + '\x7f';
      local_268[srcSize] = '\0';
      uVar25 = uVar29;
      if (maxSymbolValue != 0) {
        uVar29 = 0;
        do {
          *pcVar31 = local_268[uVar29] * '\x10' + local_268[uVar29 + 1];
          uVar29 = uVar29 + 2;
          pcVar31 = pcVar31 + 1;
        } while (uVar29 < srcSize);
      }
    }
  }
  return uVar25;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}